

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

int __thiscall ncnn::Normalize::forward_inplace(Normalize *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  float fVar3;
  double dVar4;
  int i_8;
  float scale_4;
  float *ptr_7;
  int q_8;
  float a_3;
  float *ptr_6;
  int q_7;
  float ssum_4;
  int i_7;
  int i_6;
  float *ptr_5;
  int q_6;
  float a_2;
  float *ptr_4;
  int q_5;
  float ssum_3;
  int i_5;
  float scale_3;
  Mat square_sum_blob_1;
  int i_4;
  float scale_2;
  float a_1;
  int i_3;
  float ssum_2;
  float *ptr_3;
  int q_4;
  int i_2;
  float scale_1;
  float *ptr_2;
  int q_3;
  int i_1;
  float *ptr_1;
  int q_2;
  float scale;
  float a;
  int q_1;
  float ssum;
  int i;
  float ssum_1;
  float *ptr;
  int q;
  Mat square_sum_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffaf0;
  float in_stack_fffffffffffffaf4;
  Mat *in_stack_fffffffffffffaf8;
  size_t in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  int _w;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  float local_450;
  int local_3b0;
  Mat local_3a8;
  float *local_368;
  int local_35c;
  float local_358;
  float local_354;
  Mat local_350;
  float *local_310;
  int local_308;
  float local_304;
  int local_300;
  int local_2fc;
  Mat local_2f8;
  float *local_2b8;
  int local_2ac;
  float local_2a8;
  float local_2a4;
  Mat local_2a0;
  float *local_260;
  int local_258;
  float local_254;
  int local_250;
  float local_24c;
  Mat local_248;
  int local_208;
  float local_204;
  float local_200;
  float local_1fc;
  int local_1f8;
  float local_1f4;
  Mat local_1f0;
  float *local_1b0;
  int local_1a4;
  int local_1a0;
  float local_19c;
  Mat local_198;
  float *local_158;
  int local_150;
  int local_14c;
  Mat local_148;
  float *local_108;
  int local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  int local_f0;
  float local_ec;
  int local_e8;
  float local_e4;
  Mat local_e0;
  float *local_a0;
  int local_94;
  undefined4 local_90;
  Mat local_80;
  int local_3c;
  undefined8 local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  _w = (int)((ulong)in_stack_fffffffffffffb08 >> 0x20);
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)(in_RSI + 0x34);
  local_38 = *(undefined8 *)(in_RSI + 0x10);
  local_3c = local_24 * local_28;
  if ((*(int *)(in_RDI + 0xb8) == 0) || (*(int *)(in_RDI + 0xbc) == 0)) {
    if ((*(int *)(in_RDI + 0xb8) == 0) || (*(int *)(in_RDI + 0xbc) != 0)) {
      if ((*(int *)(in_RDI + 0xb8) == 0) && (*(int *)(in_RDI + 0xbc) != 0)) {
        ncnn::Mat::Mat(&local_248);
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),_w,
                          in_stack_fffffffffffffb00,(Allocator *)in_stack_fffffffffffffaf8);
        bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0
                                                ));
        if (bVar1) {
          local_4 = -100;
        }
        else {
          if (*(int *)(in_RDI + 0xc0) == 0) {
            for (local_300 = 0; local_300 < local_3c; local_300 = local_300 + 1) {
              local_304 = 0.0;
              for (local_308 = 0; local_308 < local_2c; local_308 = local_308 + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffaf4);
                pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_350);
                ncnn::Mat::~Mat((Mat *)0x1ec4a7);
                local_304 = pfVar2[local_300] * pfVar2[local_300] + local_304;
                local_310 = pfVar2;
              }
              if (*(int *)(in_RDI + 0xcc) == 0) {
                dVar4 = std::sqrt((double)(ulong)(uint)(local_304 + *(float *)(in_RDI + 0xc4)));
                local_354 = SUB84(dVar4,0);
              }
              else if (*(int *)(in_RDI + 0xcc) == 1) {
                dVar4 = std::sqrt((double)(ulong)(uint)local_304);
                local_358 = SUB84(dVar4,0);
                pfVar2 = std::max<float>(&local_358,(float *)(in_RDI + 0xc4));
                local_354 = *pfVar2;
              }
              else {
                pfVar2 = std::max<float>(&local_304,(float *)(in_RDI + 0xc4));
                dVar4 = std::sqrt((double)(ulong)(uint)*pfVar2);
                local_354 = SUB84(dVar4,0);
              }
              local_354 = 1.0 / local_354;
              fVar3 = local_354;
              pfVar2 = ncnn::Mat::operator[](&local_248,(long)local_300);
              *pfVar2 = fVar3;
            }
            for (local_35c = 0; local_35c < local_2c; local_35c = local_35c + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffaf4);
              pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_3a8);
              ncnn::Mat::~Mat((Mat *)0x1ec700);
              local_368 = pfVar2;
              pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd0),(long)local_35c);
              fVar3 = *pfVar2;
              for (local_3b0 = 0; local_3b0 < local_3c; local_3b0 = local_3b0 + 1) {
                in_stack_fffffffffffffaf4 = local_368[local_3b0];
                in_stack_fffffffffffffaf8 = (Mat *)ncnn::Mat::operator[](&local_248,(long)local_3b0)
                ;
                local_368[local_3b0] =
                     in_stack_fffffffffffffaf4 * *(float *)&in_stack_fffffffffffffaf8->data * fVar3;
              }
            }
          }
          else {
            pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd0),0);
            local_24c = *pfVar2;
            for (local_250 = 0; local_250 < local_3c; local_250 = local_250 + 1) {
              local_254 = 0.0;
              for (local_258 = 0; local_258 < local_2c; local_258 = local_258 + 1) {
                ncnn::Mat::channel(in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffaf4);
                pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_2a0);
                ncnn::Mat::~Mat((Mat *)0x1ec0bc);
                local_254 = pfVar2[local_250] * pfVar2[local_250] + local_254;
                local_260 = pfVar2;
              }
              if (*(int *)(in_RDI + 0xcc) == 0) {
                dVar4 = std::sqrt((double)(ulong)(uint)(local_254 + *(float *)(in_RDI + 0xc4)));
                local_2a4 = SUB84(dVar4,0);
              }
              else if (*(int *)(in_RDI + 0xcc) == 1) {
                dVar4 = std::sqrt((double)(ulong)(uint)local_254);
                local_2a8 = SUB84(dVar4,0);
                pfVar2 = std::max<float>(&local_2a8,(float *)(in_RDI + 0xc4));
                local_2a4 = *pfVar2;
              }
              else {
                pfVar2 = std::max<float>(&local_254,(float *)(in_RDI + 0xc4));
                dVar4 = std::sqrt((double)(ulong)(uint)*pfVar2);
                local_2a4 = SUB84(dVar4,0);
              }
              local_2a4 = 1.0 / local_2a4;
              fVar3 = local_2a4 * local_24c;
              pfVar2 = ncnn::Mat::operator[](&local_248,(long)local_250);
              *pfVar2 = fVar3;
            }
            for (local_2ac = 0; local_2ac < local_2c; local_2ac = local_2ac + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffaf4);
              pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_2f8);
              ncnn::Mat::~Mat((Mat *)0x1ec349);
              local_2b8 = pfVar2;
              for (local_2fc = 0; local_2fc < local_3c; local_2fc = local_2fc + 1) {
                fVar3 = local_2b8[local_2fc];
                pfVar2 = ncnn::Mat::operator[](&local_248,(long)local_2fc);
                local_2b8[local_2fc] = fVar3 * *pfVar2;
              }
            }
          }
          local_4 = 0;
        }
        local_90 = 1;
        ncnn::Mat::~Mat((Mat *)0x1ec833);
      }
      else {
        local_4 = 0;
      }
    }
    else {
      for (local_1a4 = 0; local_1a4 < local_2c; local_1a4 = local_1a4 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffaf4);
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_1f0);
        ncnn::Mat::~Mat((Mat *)0x1ebc77);
        local_1f4 = 0.0;
        for (local_1f8 = 0; local_1f8 < local_3c; local_1f8 = local_1f8 + 1) {
          local_1f4 = pfVar2[local_1f8] * pfVar2[local_1f8] + local_1f4;
        }
        local_1b0 = pfVar2;
        if (*(int *)(in_RDI + 0xcc) == 0) {
          dVar4 = std::sqrt((double)(ulong)(uint)(local_1f4 + *(float *)(in_RDI + 0xc4)));
          local_1fc = SUB84(dVar4,0);
        }
        else if (*(int *)(in_RDI + 0xcc) == 1) {
          dVar4 = std::sqrt((double)(ulong)(uint)local_1f4);
          local_200 = SUB84(dVar4,0);
          pfVar2 = std::max<float>(&local_200,(float *)(in_RDI + 0xc4));
          local_1fc = *pfVar2;
        }
        else {
          pfVar2 = std::max<float>(&local_1f4,(float *)(in_RDI + 0xc4));
          dVar4 = std::sqrt((double)(ulong)(uint)*pfVar2);
          local_1fc = SUB84(dVar4,0);
        }
        local_1fc = 1.0 / local_1fc;
        fVar3 = local_1fc;
        if (*(int *)(in_RDI + 0xc0) == 0) {
          pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd0),(long)local_1a4);
          local_450 = *pfVar2;
        }
        else {
          pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd0),0);
          local_450 = *pfVar2;
        }
        local_204 = fVar3 * local_450;
        for (local_208 = 0; local_208 < local_3c; local_208 = local_208 + 1) {
          local_1b0[local_208] = local_1b0[local_208] * local_204;
        }
      }
      local_4 = 0;
    }
  }
  else {
    ncnn::Mat::Mat(&local_80);
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),_w,
                      in_stack_fffffffffffffb00,(Allocator *)in_stack_fffffffffffffaf8);
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    if (bVar1) {
      local_4 = -100;
    }
    else {
      for (local_94 = 0; local_94 < local_2c; local_94 = local_94 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffaf4);
        pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_e0);
        ncnn::Mat::~Mat((Mat *)0x1eb608);
        local_e4 = 0.0;
        for (local_e8 = 0; fVar3 = local_e4, local_e8 < local_3c; local_e8 = local_e8 + 1) {
          local_e4 = pfVar2[local_e8] * pfVar2[local_e8] + local_e4;
        }
        local_a0 = pfVar2;
        pfVar2 = ncnn::Mat::operator[](&local_80,(long)local_94);
        *pfVar2 = fVar3;
      }
      local_ec = 0.0;
      for (local_f0 = 0; local_f0 < local_2c; local_f0 = local_f0 + 1) {
        pfVar2 = ncnn::Mat::operator[](&local_80,(long)local_f0);
        local_ec = *pfVar2 + local_ec;
      }
      if (*(int *)(in_RDI + 0xcc) == 0) {
        dVar4 = std::sqrt((double)(ulong)(uint)(local_ec + *(float *)(in_RDI + 0xc4)));
        local_f4 = SUB84(dVar4,0);
      }
      else if (*(int *)(in_RDI + 0xcc) == 1) {
        dVar4 = std::sqrt((double)(ulong)(uint)local_ec);
        local_f8 = SUB84(dVar4,0);
        pfVar2 = std::max<float>(&local_f8,(float *)(in_RDI + 0xc4));
        local_f4 = *pfVar2;
      }
      else {
        pfVar2 = std::max<float>(&local_ec,(float *)(in_RDI + 0xc4));
        dVar4 = std::sqrt((double)(ulong)(uint)*pfVar2);
        local_f4 = SUB84(dVar4,0);
      }
      local_f4 = 1.0 / local_f4;
      fVar3 = local_f4;
      if (*(int *)(in_RDI + 0xc0) == 0) {
        for (local_150 = 0; local_150 < local_2c; local_150 = local_150 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffaf4);
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_198);
          ncnn::Mat::~Mat((Mat *)0x1ebaa8);
          fVar3 = local_f4;
          local_158 = pfVar2;
          pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd0),(long)local_150);
          local_19c = fVar3 * *pfVar2;
          for (local_1a0 = 0; local_1a0 < local_3c; local_1a0 = local_1a0 + 1) {
            local_158[local_1a0] = local_158[local_1a0] * local_19c;
          }
        }
      }
      else {
        pfVar2 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xd0),0);
        local_fc = fVar3 * *pfVar2;
        for (local_100 = 0; local_100 < local_2c; local_100 = local_100 + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffaf8,(int)in_stack_fffffffffffffaf4);
          pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_148);
          ncnn::Mat::~Mat((Mat *)0x1eb993);
          for (local_14c = 0; local_14c < local_3c; local_14c = local_14c + 1) {
            pfVar2[local_14c] = pfVar2[local_14c] * local_fc;
          }
          local_108 = pfVar2;
        }
      }
      local_4 = 0;
    }
    local_90 = 1;
    ncnn::Mat::~Mat((Mat *)0x1ebbcf);
  }
  return local_4;
}

Assistant:

int Normalize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        float ssum = 0.f;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        float a;
        if (eps_mode == 0) // caffe/mxnet
        {
            a = static_cast<float>(1.f / sqrt(ssum + eps));
        }
        else if (eps_mode == 1) // pytorch
        {
            a = 1.f / std::max((float)sqrt(ssum), eps);
        }
        else //if (eps_mode == 2) // tensorflow
        {
            a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
        }

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a;
            if (eps_mode == 0) // caffe/mxnet
            {
                a = static_cast<float>(1.f / sqrt(ssum + eps));
            }
            else if (eps_mode == 1) // pytorch
            {
                a = 1.f / std::max((float)sqrt(ssum), eps);
            }
            else //if (eps_mode == 2) // tensorflow
            {
                a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
            }

            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                ptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = 0.f;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = static_cast<float>(1.f / sqrt(ssum + eps));
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
                }

                square_sum_blob[i] = a * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = 0.f;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = static_cast<float>(1.f / sqrt(ssum + eps));
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = static_cast<float>(1.f / sqrt(std::max(ssum, eps)));
                }

                square_sum_blob[i] = a;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}